

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

int load_private_key(EC_KEY **priv_key,uint8_t *bytes_key)

{
  int iVar1;
  EC_KEY *key;
  int iVar2;
  long in_FS_OFFSET;
  char *p;
  uint8_t *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *priv_key = (EC_KEY *)0x0;
  iVar2 = 0;
  local_20 = bytes_key;
  key = d2i_ECPrivateKey((EC_KEY **)0x0,&local_20,0x79);
  *priv_key = (EC_KEY *)key;
  if (key != (EC_KEY *)0x0) {
    iVar1 = EC_KEY_check_key(key);
    if (iVar1 != 0) goto LAB_00111f9d;
    EC_KEY_free((EC_KEY *)*priv_key);
    *priv_key = (EC_KEY *)0x0;
  }
  iVar2 = -3;
LAB_00111f9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int load_private_key(EC_KEY **priv_key, uint8_t *bytes_key)
{
	int status = 0;
	char *p = (char *)bytes_key;
	*priv_key = NULL;

	/* The private key copying is similar to the public key
	 * copying, except that the private key is returned directly
	 * as an EC_KEY.
	 */
	*priv_key = d2i_ECPrivateKey(NULL, (const unsigned char **)&p, (long)PRIVATE_KEY_LENGTH);

	if (!*priv_key)
		return RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;

	status = EC_KEY_check_key(*priv_key);
	if (status == 0) {
		EC_KEY_free(*priv_key);
		*priv_key = NULL;
		return RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
	}

	return RTR_BGPSEC_SUCCESS;
}